

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  TString *pTVar2;
  TString **ppTVar3;
  long lVar4;
  int iVar5;
  TString *pTVar6;
  long lVar7;
  char *__assertion;
  uint uVar8;
  long lVar9;
  
  pgVar1 = L->l_G;
  lVar9 = (long)newsize;
  iVar5 = (pgVar1->strt).size;
  if (iVar5 < newsize) {
    ppTVar3 = (TString **)luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar5 << 3,lVar9 * 8);
    (pgVar1->strt).hash = ppTVar3;
    iVar5 = (pgVar1->strt).size;
    for (lVar4 = (long)iVar5; lVar4 < lVar9; lVar4 = lVar4 + 1) {
      (pgVar1->strt).hash[lVar4] = (TString *)0x0;
    }
  }
  for (lVar4 = 0; lVar7 = (long)iVar5, lVar4 < lVar7; lVar4 = lVar4 + 1) {
    ppTVar3 = (pgVar1->strt).hash;
    pTVar6 = ppTVar3[lVar4];
    ppTVar3[lVar4] = (TString *)0x0;
    while (pTVar6 != (TString *)0x0) {
      if (1 < (uint)POPCOUNT(newsize)) {
        __assertion = "(newsize&(newsize-1))==0";
        uVar8 = 0x54;
        goto LAB_00136fb3;
      }
      pTVar2 = (pTVar6->u).hnext;
      uVar8 = pTVar6->hash & newsize - 1U;
      pTVar6->u = *(anon_union_8_2_b887aad4_for_u *)((pgVar1->strt).hash + uVar8);
      (pgVar1->strt).hash[uVar8] = pTVar6;
      pTVar6 = pTVar2;
    }
    iVar5 = (pgVar1->strt).size;
  }
  if (newsize < iVar5) {
    ppTVar3 = (pgVar1->strt).hash;
    if ((ppTVar3[lVar9] != (TString *)0x0) || (ppTVar3[lVar7 + -1] != (TString *)0x0)) {
      __assertion = "tb->hash[newsize] == ((void*)0) && tb->hash[tb->size - 1] == ((void*)0)";
      uVar8 = 0x5c;
LAB_00136fb3:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                    ,uVar8,"void luaS_resize(lua_State *, int)");
    }
    ppTVar3 = (TString **)luaM_realloc_(L,ppTVar3,lVar7 << 3,lVar9 << 3);
    (pgVar1->strt).hash = ppTVar3;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  int i;
  stringtable *tb = &G(L)->strt;
  if (newsize > tb->size) {  /* grow table if needed */
    luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
    for (i = tb->size; i < newsize; i++)
      tb->hash[i] = NULL;
  }
  for (i = 0; i < tb->size; i++) {  /* rehash */
    TString *p = tb->hash[i];
    tb->hash[i] = NULL;
    while (p) {  /* for each node in the list */
      TString *hnext = p->u.hnext;  /* save next */
      unsigned int h = lmod(p->hash, newsize);  /* new position */
      p->u.hnext = tb->hash[h];  /* chain it */
      tb->hash[h] = p;
      p = hnext;
    }
  }
  if (newsize < tb->size) {  /* shrink table if needed */
    /* vanishing slice should be empty */
    lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
    luaM_reallocvector(L, tb->hash, tb->size, newsize, TString *);
  }
  tb->size = newsize;
}